

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O0

int __thiscall libtorrent::bitfield::count(bitfield *this)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  undefined4 local_2c;
  int i_1;
  uint32_t cnt;
  int i;
  int words;
  int ret;
  bitfield *this_local;
  
  i = 0;
  iVar1 = num_words(this);
  if ((libtorrent::aux::mmx_support & 1) == 0) {
    for (local_2c = 1; local_2c < iVar1 + 1; local_2c = local_2c + 1) {
      puVar2 = libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator[]
                         (&this->m_buf,(long)local_2c);
      uVar3 = (ulong)*puVar2 - ((ulong)(*puVar2 >> 1) & 0x5555555555555555);
      uVar3 = (uVar3 & 0x3333333333333333) + (uVar3 >> 2 & 0x3333333333333333);
      i = (uint)(byte)((uVar3 + (uVar3 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) + i;
    }
    this_local._4_4_ = i;
  }
  else {
    for (i_1 = 1; i_1 < iVar1 + 1; i_1 = i_1 + 1) {
      puVar2 = libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator[](&this->m_buf,(long)i_1)
      ;
      i = POPCOUNT(*puVar2) + i;
    }
    this_local._4_4_ = i;
  }
  return this_local._4_4_;
}

Assistant:

int bitfield::count() const noexcept
	{
		int ret = 0;
		int const words = num_words();
#if TORRENT_HAS_SSE
		if (aux::mmx_support)
		{
			for (int i = 1; i < words + 1; ++i)
			{
#ifdef __GNUC__
				std::uint32_t cnt = 0;
				__asm__("popcnt %1, %0"
					: "=r"(cnt)
					: "r"(m_buf[i]));
				ret += cnt;
#else
				ret += _mm_popcnt_u32(m_buf[i]);
#endif
			}

			TORRENT_ASSERT(ret <= size());
			TORRENT_ASSERT(ret >= 0);
			return ret;
		}
#endif // TORRENT_HAS_SSE

#if TORRENT_HAS_ARM_NEON && defined __arm__
		if (aux::arm_neon_support)
		{
			for (int i = 1; i < words + 1; ++i)
			{
				std::uint32_t cnt;
				__asm__(
					"vld1.u32 d0[0], [%1] \n"
					"vcnt.u8 d0, d0 \n"
					"vpaddl.u8 d0, d0 \n"
					"vpaddl.u16 d0, d0 \n"
					"vst1.u32 d0[0], [%0]"
					:: "r"(&cnt), "r"(&m_buf[i])
					: "d0", "memory");
				ret += cnt;
			}

			TORRENT_ASSERT(ret <= size());
			TORRENT_ASSERT(ret >= 0);
			return ret;
		}
#endif // TORRENT_HAS_ARM_NEON

		for (int i = 1; i < words + 1; ++i)
		{
#if defined __GNUC__ || defined __clang__
			ret += __builtin_popcountl(m_buf[i]);
#else
			std::uint32_t const v = m_buf[i];
			// from:
			// http://graphics.stanford.edu/~seander/bithacks.html#CountBitsSetParallel
			static const int S[] = {1, 2, 4, 8, 16}; // Magic Binary Numbers
			static const std::uint32_t B[] = {0x55555555, 0x33333333, 0x0F0F0F0F, 0x00FF00FF, 0x0000FFFF};

			std::uint32_t c = v - ((v >> 1) & B[0]);
			c = ((c >> S[1]) & B[1]) + (c & B[1]);
			c = ((c >> S[2]) + c) & B[2];
			c = ((c >> S[3]) + c) & B[3];
			c = ((c >> S[4]) + c) & B[4];
			ret += c;
			TORRENT_ASSERT(ret <= size());
#endif
		}

		TORRENT_ASSERT(ret <= size());
		TORRENT_ASSERT(ret >= 0);
		return ret;
	}